

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::CommonCore(CommonCore *this,string_view coreName)

{
  string_view broker_name;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Core *in_RDI;
  double in_stack_ffffffffffffff18;
  __integral_type_conflict __i;
  Core *pCVar1;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_stack_ffffffffffffff20;
  TriggerVariable *this_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 uVar3;
  BrokerBase *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  id local_48;
  id local_40 [3];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_10;
  undefined8 uStack_8;
  
  uVar3 = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  Core::Core(in_RDI);
  local_28 = local_10;
  uStack_20 = uStack_8;
  broker_name._M_str = in_stack_ffffffffffffffa0;
  broker_name._M_len = in_stack_ffffffffffffff98;
  BrokerBase::BrokerBase(in_stack_ffffffffffffff90,broker_name,(bool)uVar3);
  in_RDI->_vptr_Core = (_func_int **)&PTR__CommonCore_0092cfd0;
  in_RDI[1]._vptr_Core = (_func_int **)&DAT_0092d360;
  std::atomic<double>::atomic((atomic<double> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
  ;
  __i = (__integral_type_conflict)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  *(undefined4 *)&in_RDI[0x55]._vptr_Core = 0;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 0x55));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::
  map<helics::GlobalFederateId,_helics::route_id,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
  ::map((map<helics::GlobalFederateId,_helics::route_id,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
         *)0x45fd53);
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::SimpleQueue
            ((SimpleQueue<helics::ActionMessage,_std::mutex> *)in_stack_ffffffffffffff20);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                   *)0x45fd88);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x45fda4);
  std::make_unique<helics::TimeoutMonitor>();
  *(undefined4 *)&in_RDI[0x7c]._vptr_Core = 0;
  std::atomic<short>::atomic
            ((atomic<short> *)in_stack_ffffffffffffff20,
             (__integral_type_conflict3)((uint)__i >> 0x10));
  *(undefined1 *)((long)&in_RDI[0x7c]._vptr_Core + 6) = 0;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::shared_guarded<>((shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                      *)in_stack_ffffffffffffff20);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
  DualStringMappedVector
            ((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
              *)in_stack_ffffffffffffff20);
  std::atomic<int>::atomic((atomic<int> *)in_stack_ffffffffffffff20,__i);
  gmlc::libguarded::ordered_guarded<helics::HandleManager,_std::shared_mutex>::ordered_guarded<>
            (in_stack_ffffffffffffff20);
  HandleManager::HandleManager(&in_stack_ffffffffffffff20->m_obj);
  CLI::std::
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ::vector((vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
            *)0x45fe85);
  in_RDI[0x129]._vptr_Core = (_func_int **)0x0;
  std::thread::id::id(local_40);
  std::atomic<std::thread::id>::atomic((atomic<std::thread::id> *)(in_RDI + 0x12a),local_40[0]);
  std::atomic<helics::GlobalFederateId>::atomic
            ((atomic<helics::GlobalFederateId> *)in_stack_ffffffffffffff20);
  std::
  map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::map((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
         *)0x45feef);
  std::atomic<int>::atomic((atomic<int> *)in_stack_ffffffffffffff20,__i);
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  DelayedObjects((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff20);
  std::
  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::deque((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
           *)0x45ff3a);
  pCVar1 = in_RDI + 0x15a;
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::vector((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            *)0x45ff54);
  in_RDI[0x15d]._vptr_Core = (_func_int **)0x0;
  this_00 = (TriggerVariable *)(in_RDI + 0x15e);
  std::thread::id::id(&local_48);
  std::atomic<std::thread::id>::atomic((atomic<std::thread::id> *)this_00,local_48);
  std::atomic<helics::GlobalFederateId>::atomic((atomic<helics::GlobalFederateId> *)this_00);
  uVar2 = 0;
  std::atomic<unsigned_short>::atomic
            ((atomic<unsigned_short> *)this_00,(__integral_type_conflict4)((ulong)pCVar1 >> 0x30));
  uVar3 = (undefined1)((ulong)pCVar1 >> 0x38);
  std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::array
            ((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL> *
             )CONCAT44(uVar2,in_stack_ffffffffffffff30));
  gmlc::concurrency::TriggerVariable::TriggerVariable(this_00,(bool)uVar3);
  std::atomic<bool>::atomic(&this_00->triggered,(bool)uVar3);
  return;
}

Assistant:

CommonCore::CommonCore(std::string_view coreName):
    BrokerBase(coreName), timeoutMon(std::make_unique<TimeoutMonitor>())
{
}